

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::GetActiveDataset
          (CommissionerImpl *this,Handler<ActiveOperationalDataset> *aHandler,uint16_t aDatasetFlags
          )

{
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  *this_00;
  anon_class_32_1_d0c21527 rawDatasetHandler;
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::function((function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
              *)&local_38,aHandler);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
              *)0x0;
  uStack_50 = 0;
  this_00 = (function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
             *)operator_new(0x20);
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::function(this_00,(function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
                      *)&local_38);
  pcStack_40 = std::
               _Function_handler<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:457:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:457:30)>
             ::_M_manager;
  local_58 = this_00;
  (*(this->super_Commissioner)._vptr_Commissioner[0x1b])(this,&local_58,(ulong)aDatasetFlags);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerImpl::GetActiveDataset(Handler<ActiveOperationalDataset> aHandler, uint16_t aDatasetFlags)
{
    auto rawDatasetHandler = [aHandler](const ByteArray *aRawDataset, Error aError) {
        Error                    error;
        ActiveOperationalDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, *aRawDataset));

        aHandler(&dataset, error);
    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    GetRawActiveDataset(rawDatasetHandler, aDatasetFlags);
}